

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteVectorReader.h
# Opt level: O1

void __thiscall ByteVectorReader::grow(ByteVectorReader *this,size_t n)

{
  pointer puVar1;
  pointer puVar2;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_bv,
             (size_type)
             ((this->_bv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
             (n - (long)(this->_bv).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start)));
  puVar1 = (this->_bv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->_bv).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_MemoryReader)._mem = puVar1;
  (this->super_MemoryReader)._size = (long)puVar2 - (long)puVar1;
  return;
}

Assistant:

virtual void grow(size_t n)
    {
        _bv.resize(_bv.size()+n);
        setbuf(&_bv.front(), _bv.size());
    }